

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

set_value set_remove(set s,set_key key)

{
  int iVar1;
  void **value_00;
  void *in_RSI;
  comparable_callback in_RDI;
  set_value value;
  bucket b;
  size_t index;
  set_hash h;
  bucket in_stack_fffffffffffffff8;
  
  if ((in_RDI == (comparable_callback)0x0) || (in_RSI == (void *)0x0)) {
    log_write_impl_va("metacall",0x16d,"set_remove",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                      ,3,"Invalid set remove parameters");
  }
  else {
    value_00 = (void **)(**(code **)(in_RDI + 0x20))(in_RSI);
    iVar1 = bucket_remove(in_stack_fffffffffffffff8,in_RDI,in_RSI,value_00);
    if (iVar1 == 0) {
      *(long *)in_RDI = *(long *)in_RDI + -1;
      iVar1 = set_bucket_realloc((set)h);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x181,"set_remove",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                          ,3,"Invalid set bucket remove reallocation");
      }
    }
    else {
      log_write_impl_va("metacall",0x179,"set_remove",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                        ,3,"Invalid set bucket remove: %p",in_RSI);
    }
  }
  return (set_value)0x0;
}

Assistant:

set_value set_remove(set s, set_key key)
{
	set_hash h;
	size_t index;
	bucket b;
	set_value value = NULL;

	if (s == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set remove parameters");
		return NULL;
	}

	h = s->hash_cb(key);

	index = h % s->capacity;

	b = &s->buckets[index];

	if (bucket_remove(b, s->compare_cb, key, &value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket remove: %p", key);
		return NULL;
	}

	--s->count;

	if (set_bucket_realloc(s) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set bucket remove reallocation");
		return NULL;
	}

	return value;
}